

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall protozero::MessageFilter::SetUnrecoverableErrorState(MessageFilter *this)

{
  pointer pSVar1;
  
  this->error_ = true;
  pSVar1 = (this->stack_).
           super__Vector_base<protozero::MessageFilter::StackState,_std::allocator<protozero::MessageFilter::StackState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->stack_).
      super__Vector_base<protozero::MessageFilter::StackState,_std::allocator<protozero::MessageFilter::StackState>_>
      ._M_impl.super__Vector_impl_data._M_finish != pSVar1) {
    (this->stack_).
    super__Vector_base<protozero::MessageFilter::StackState,_std::allocator<protozero::MessageFilter::StackState>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar1;
  }
  perfetto::std::
  vector<protozero::MessageFilter::StackState,_std::allocator<protozero::MessageFilter::StackState>_>
  ::resize(&this->stack_,1);
  pSVar1 = (this->stack_).
           super__Vector_base<protozero::MessageFilter::StackState,_std::allocator<protozero::MessageFilter::StackState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1->in_bytes_limit = 0xffffffff;
  pSVar1->eat_next_bytes = 0xffffffff;
  pSVar1->passthrough_eaten_bytes = false;
  this->out_ = (this->out_buf_)._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  return;
}

Assistant:

void MessageFilter::SetUnrecoverableErrorState() {
  error_ = true;
  stack_.clear();
  stack_.resize(1);
  auto& state = stack_[0];
  state.eat_next_bytes = UINT32_MAX;
  state.in_bytes_limit = UINT32_MAX;
  state.passthrough_eaten_bytes = false;
  out_ = out_buf_.get();  // Reset the write pointer.
}